

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateClassMethods
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  long lVar2;
  scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator> *this_00;
  EnumGenerator *this_01;
  scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator> *this_02;
  MessageGenerator *this_03;
  Descriptor *pDVar3;
  FieldGenerator *pFVar4;
  scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator> *this_04;
  ExtensionGenerator *this_05;
  FieldDescriptor *field;
  cxx *this_06;
  int i;
  long lVar5;
  long lVar6;
  string local_70;
  string local_50;
  
  for (lVar5 = 0; pDVar3 = this->descriptor_, lVar5 < *(int *)(pDVar3 + 0x48); lVar5 = lVar5 + 1) {
    this_00 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>_>
              ::operator[](&this->enum_generators_,lVar5);
    this_01 = internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>::operator->
                        (this_00);
    EnumGenerator::GenerateMethods(this_01,printer);
  }
  for (lVar5 = 0; lVar5 < *(int *)(pDVar3 + 0x38); lVar5 = lVar5 + 1) {
    this_02 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
              ::operator[](&this->nested_generators_,lVar5);
    this_03 = internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::operator->
                        (this_02);
    GenerateClassMethods(this_03,printer);
    io::Printer::Print(printer,"\n");
    io::Printer::Print(printer,
                       "// -------------------------------------------------------------------\n");
    io::Printer::Print(printer,"\n");
    pDVar3 = this->descriptor_;
  }
  lVar5 = 0;
  for (lVar6 = 0; lVar6 < *(int *)(pDVar3 + 0x2c); lVar6 = lVar6 + 1) {
    pFVar4 = FieldGeneratorMap::get
                       (&this->field_generators_,
                        (FieldDescriptor *)(*(long *)(pDVar3 + 0x30) + lVar5));
    (*pFVar4->_vptr_FieldGenerator[5])(pFVar4,printer);
    pDVar3 = this->descriptor_;
    lVar5 = lVar5 + 0x78;
  }
  io::Printer::Print(printer,"#ifndef _MSC_VER\n");
  lVar6 = 0;
  lVar5 = 0;
  while( true ) {
    iVar1 = *(int *)(this->descriptor_ + 0x2c);
    if (iVar1 <= lVar5) break;
    lVar2 = *(long *)(this->descriptor_ + 0x30);
    this_06 = (cxx *)(lVar2 + lVar6);
    ClassName_abi_cxx11_
              (&local_50,*(cxx **)(this_06 + (ulong)*(byte *)(lVar2 + 0x34 + lVar6) * 8 + 0x38),
               (Descriptor *)0x0,SUB41(iVar1,0));
    FieldConstantName_abi_cxx11_(&local_70,this_06,field);
    io::Printer::Print(printer,"const int $classname$::$constant_name$;\n","classname",&local_50,
                       "constant_name",&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    lVar5 = lVar5 + 1;
    lVar6 = lVar6 + 0x78;
  }
  io::Printer::Print(printer,"#endif  // !_MSC_VER\n\n");
  for (lVar5 = 0; lVar5 < *(int *)(this->descriptor_ + 0x68); lVar5 = lVar5 + 1) {
    this_04 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator>_>
              ::operator[](&this->extension_generators_,lVar5);
    this_05 = internal::scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator>::operator->
                        (this_04);
    ExtensionGenerator::GenerateDefinition(this_05,printer);
  }
  GenerateStructors(this,printer);
  io::Printer::Print(printer,"\n");
  if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) != 2) {
    GenerateClear(this,printer);
    io::Printer::Print(printer,"\n");
    GenerateMergeFromCodedStream(this,printer);
    io::Printer::Print(printer,"\n");
    GenerateSerializeWithCachedSizes(this,printer);
    io::Printer::Print(printer,"\n");
    if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) == 1) {
      GenerateSerializeWithCachedSizesToArray(this,printer);
      io::Printer::Print(printer,"\n");
    }
    GenerateByteSize(this,printer);
    io::Printer::Print(printer,"\n");
    GenerateMergeFrom(this,printer);
    io::Printer::Print(printer,"\n");
    GenerateCopyFrom(this,printer);
    io::Printer::Print(printer,"\n");
    GenerateIsInitialized(this,printer);
    io::Printer::Print(printer,"\n");
    GenerateParseFromXmlString(this,printer);
    io::Printer::Print(printer,"\n");
    GenerateParsePartialFromXmlString(this,printer);
    io::Printer::Print(printer,"\n");
    GenerateSerializeToXmlString(this,printer);
    io::Printer::Print(printer,"\n");
    GenerateSerializePartialToXmlString(this,printer);
    io::Printer::Print(printer,"\n");
  }
  GenerateSwap(this,printer);
  io::Printer::Print(printer,"\n");
  if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) == 3) {
    io::Printer::Print(printer,
                       "::std::string $classname$::GetTypeName() const {\n  return \"$type_name$\";\n}\n\n"
                       ,"classname",&this->classname_,"type_name",
                       *(string **)(this->descriptor_ + 8));
  }
  else {
    io::Printer::Print(printer,
                       "::google::protobuf::Metadata $classname$::GetMetadata() const {\n  protobuf_AssignDescriptorsOnce();\n  ::google::protobuf::Metadata metadata;\n  metadata.descriptor = $classname$_descriptor_;\n  metadata.reflection = $classname$_reflection_;\n  return metadata;\n}\n\n"
                       ,"classname",&this->classname_);
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateClassMethods(io::Printer* printer) {
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    enum_generators_[i]->GenerateMethods(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    nested_generators_[i]->GenerateClassMethods(printer);
    printer->Print("\n");
    printer->Print(kThinSeparator);
    printer->Print("\n");
  }

  // Generate non-inline field definitions.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
                     .GenerateNonInlineAccessorDefinitions(printer);
  }

  // Generate field number constants.
  printer->Print("#ifndef _MSC_VER\n");
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor *field = descriptor_->field(i);
    printer->Print(
      "const int $classname$::$constant_name$;\n",
      "classname", ClassName(FieldScope(field), false),
      "constant_name", FieldConstantName(field));
  }
  printer->Print(
    "#endif  // !_MSC_VER\n"
    "\n");

  // Define extension identifiers.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    extension_generators_[i]->GenerateDefinition(printer);
  }

  GenerateStructors(printer);
  printer->Print("\n");

  if (HasGeneratedMethods(descriptor_->file())) {
    GenerateClear(printer);
    printer->Print("\n");

    GenerateMergeFromCodedStream(printer);
    printer->Print("\n");

    GenerateSerializeWithCachedSizes(printer);
    printer->Print("\n");

    if (HasFastArraySerialization(descriptor_->file())) {
      GenerateSerializeWithCachedSizesToArray(printer);
      printer->Print("\n");
    }

    GenerateByteSize(printer);
    printer->Print("\n");

    GenerateMergeFrom(printer);
    printer->Print("\n");

    GenerateCopyFrom(printer);
    printer->Print("\n");

    GenerateIsInitialized(printer);
    printer->Print("\n");

    // Generate xml support -- by chaishushan{AT}gmail.com
    GenerateParseFromXmlString(printer);
    printer->Print("\n");
    GenerateParsePartialFromXmlString(printer);
    printer->Print("\n");
    GenerateSerializeToXmlString(printer);
    printer->Print("\n");
    GenerateSerializePartialToXmlString(printer);
    printer->Print("\n");
  }

  GenerateSwap(printer);
  printer->Print("\n");

  if (HasDescriptorMethods(descriptor_->file())) {
    printer->Print(
      "::google::protobuf::Metadata $classname$::GetMetadata() const {\n"
      "  protobuf_AssignDescriptorsOnce();\n"
      "  ::google::protobuf::Metadata metadata;\n"
      "  metadata.descriptor = $classname$_descriptor_;\n"
      "  metadata.reflection = $classname$_reflection_;\n"
      "  return metadata;\n"
      "}\n"
      "\n",
      "classname", classname_);
  } else {
    printer->Print(
      "::std::string $classname$::GetTypeName() const {\n"
      "  return \"$type_name$\";\n"
      "}\n"
      "\n",
      "classname", classname_,
      "type_name", descriptor_->full_name());
  }

}